

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O2

void __thiscall CVerifyDB::~CVerifyDB(CVerifyDB *this)

{
  long in_FS_OFFSET;
  bilingual_str local_48;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.original._M_dataplus._M_p = (pointer)&local_48.original.field_2;
  local_48.original._M_string_length = 0;
  local_48.original.field_2._M_local_buf[0] = '\0';
  local_48.translated._M_dataplus._M_p = (pointer)&local_48.translated.field_2;
  local_48.translated._M_string_length = 0;
  local_48.translated.field_2._M_local_buf[0] = '\0';
  (*this->m_notifications->_vptr_Notifications[4])(this->m_notifications,&local_48,100,0);
  bilingual_str::~bilingual_str(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

CVerifyDB::~CVerifyDB()
{
    m_notifications.progress(bilingual_str{}, 100, false);
}